

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderPauseTimer(CHud *this)

{
  uint uVar1;
  IGraphics *pIVar2;
  ITextRender *pIVar3;
  CGameClient *pCVar4;
  int iVar5;
  char *pcVar6;
  int64 StringVersion;
  long in_FS_OFFSET;
  float fVar7;
  char aBuf [256];
  char acStack_128 [256];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateFlags & 0x30U) ==
      0x10) {
    pcVar6 = Localize("Game paused","");
    if (RenderPauseTimer()::s_GamePausedCursor == '\0') {
      iVar5 = __cxa_guard_acquire(&RenderPauseTimer()::s_GamePausedCursor);
      if (iVar5 != 0) {
        CTextCursor::CTextCursor(&RenderPauseTimer::s_GamePausedCursor);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderPauseTimer::s_GamePausedCursor,&__dso_handle);
        __cxa_guard_release(&RenderPauseTimer()::s_GamePausedCursor);
      }
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderPauseTimer::s_GamePausedCursor.m_CursorPos.field_0.x =
         ((float)pIVar2->m_ScreenWidth / (float)pIVar2->m_ScreenHeight) * 150.0;
    RenderPauseTimer::s_GamePausedCursor.m_CursorPos.field_1.y = 50.0;
    RenderPauseTimer::s_GamePausedCursor.m_Align = 1;
    RenderPauseTimer::s_GamePausedCursor.m_FontSize = 20.0;
    CTextCursor::Reset(&RenderPauseTimer::s_GamePausedCursor,(long)g_Localization.m_CurrentVersion);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&RenderPauseTimer::s_GamePausedCursor,pcVar6,0xffffffff);
    if (RenderPauseTimer()::s_Cursor == '\0') {
      iVar5 = __cxa_guard_acquire(&RenderPauseTimer()::s_Cursor);
      if (iVar5 != 0) {
        CTextCursor::CTextCursor(&RenderPauseTimer::s_Cursor);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderPauseTimer::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderPauseTimer()::s_Cursor);
      }
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderPauseTimer::s_Cursor.m_CursorPos.field_0.x =
         ((float)pIVar2->m_ScreenWidth / (float)pIVar2->m_ScreenHeight) * 150.0;
    RenderPauseTimer::s_Cursor.m_CursorPos.field_1.y = 75.0;
    RenderPauseTimer::s_Cursor.m_Align = 1;
    RenderPauseTimer::s_Cursor.m_FontSize = 16.0;
    pCVar4 = (this->super_CComponent).m_pClient;
    iVar5 = ((pCVar4->m_Snap).m_pGameData)->m_GameStateEndTick;
    if (iVar5 == 0) {
      uVar1 = (pCVar4->m_Snap).m_NotReadyCount;
      if (uVar1 == 1) {
        pcVar6 = "%d player not ready";
      }
      else {
        if ((int)uVar1 < 2) goto LAB_00143412;
        pcVar6 = "%d players not ready";
      }
      StringVersion = (int64)(int)(g_Localization.m_CurrentVersion << 8 | uVar1);
      pcVar6 = Localize(pcVar6,"");
      str_format(acStack_128,0x100,pcVar6,
                 (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_NotReadyCount);
      RenderReadyUpNotification(this);
    }
    else {
      fVar7 = (float)(iVar5 - pCVar4->m_pClient->m_CurGameTick) / 50.0;
      if (5.0 <= fVar7) {
        str_format(acStack_128,0x100,"%d",(ulong)(uint)(int)(fVar7 + 0.5));
      }
      else {
        str_format(acStack_128,0x100,"%.1f",(double)fVar7);
      }
      StringVersion = -1;
    }
    CTextCursor::Reset(&RenderPauseTimer::s_Cursor,StringVersion);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&RenderPauseTimer::s_Cursor,acStack_128,0xffffffff);
  }
LAB_00143412:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderPauseTimer()
{
	if((m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_STARTCOUNTDOWN|GAMESTATEFLAG_PAUSED)) == GAMESTATEFLAG_PAUSED)
	{
		char aBuf[256];
		const char *pText = Localize("Game paused");
		static CTextCursor s_GamePausedCursor;
		s_GamePausedCursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
		s_GamePausedCursor.m_Align = TEXTALIGN_TC;
		s_GamePausedCursor.m_FontSize = 20.0f;
		s_GamePausedCursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_GamePausedCursor, pText, -1);

		static CTextCursor s_Cursor;
		s_Cursor.MoveTo(150 * Graphics()->ScreenAspect(), 75);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.m_FontSize = 16.0f;

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
		{
			const int64 CursorVersion = g_Localization.Version() << 8 | m_pClient->m_Snap.m_NotReadyCount;

			if(m_pClient->m_Snap.m_NotReadyCount == 1)
				str_format(aBuf, sizeof(aBuf), Localize("%d player not ready"), m_pClient->m_Snap.m_NotReadyCount);
			else if(m_pClient->m_Snap.m_NotReadyCount > 1)
				str_format(aBuf, sizeof(aBuf), Localize("%d players not ready"), m_pClient->m_Snap.m_NotReadyCount);
			else
				return;
			RenderReadyUpNotification();
			s_Cursor.Reset(CursorVersion);
		}
		else
		{
			float Seconds = static_cast<float>(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick())/SERVER_TICK_SPEED;
			if(Seconds < 5)
				str_format(aBuf, sizeof(aBuf), "%.1f", Seconds);
			else
				str_format(aBuf, sizeof(aBuf), "%d", round_to_int(Seconds));
			s_Cursor.Reset();
		}

		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}